

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int main(int argc,char **argv)

{
  StkId pTVar1;
  FILE *__stream;
  int iVar2;
  int iVar3;
  lua_State *plVar4;
  long lVar5;
  char *pcVar6;
  code *in_RCX;
  int nrec;
  lua_CFunction *pp_Var7;
  ulong uVar8;
  
  plVar4 = (lua_State *)malloc(0x268);
  if (plVar4 != (lua_State *)0x0) {
    plVar4->next = (GCObject *)0x0;
    plVar4->tt = '\b';
    *(undefined1 *)&plVar4[1].l_G = 0x21;
    plVar4->marked = 'a';
    plVar4->status = '\0';
    plVar4->l_G = (global_State *)(plVar4 + 1);
    plVar4->stack = (StkId)0x0;
    plVar4->stacksize = 0;
    plVar4->errorJmp = (lua_longjmp *)0x0;
    plVar4->errfunc = 0;
    plVar4->hookmask = '\0';
    plVar4->allowhook = '\x01';
    plVar4->basehookcount = 0;
    plVar4->hookcount = 0;
    plVar4->hook = (lua_Hook)0x0;
    plVar4->openupval = (GCObject *)0x0;
    plVar4->base_ci = (CallInfo *)0x0;
    (plVar4->l_gt).tt = 0;
    plVar4->ci = (CallInfo *)0x0;
    plVar4->savedpc = (Instruction *)0x0;
    plVar4->size_ci = 0;
    plVar4->nCcalls = 0;
    plVar4->baseCcalls = 0;
    plVar4[1].top = (StkId)l_alloc;
    plVar4[1].base = (StkId)0x0;
    plVar4[1].errfunc = (ptrdiff_t)plVar4;
    plVar4[2].base = (StkId)(plVar4 + 2);
    plVar4[2].l_G = (global_State *)(plVar4 + 2);
    *(undefined4 *)&plVar4[1].errorJmp = 0;
    plVar4[1].stacksize = 0;
    plVar4[1].size_ci = 0;
    plVar4[1].openupval = (GCObject *)0x0;
    *(undefined1 *)((long)&plVar4[1].l_G + 1) = 0;
    plVar4[1].next = (GCObject *)0x0;
    plVar4[1].tt = '\0';
    plVar4[1].marked = '\0';
    plVar4[1].status = '\0';
    *(undefined5 *)&plVar4[1].field_0xb = 0;
    plVar4[1].basehookcount = 0;
    plVar4[1].hookcount = 0;
    plVar4[1].hook = (lua_Hook)0x0;
    plVar4[1].ci = (CallInfo *)plVar4;
    *(undefined4 *)((long)&plVar4[1].l_G + 4) = 0;
    plVar4[1].savedpc = (Instruction *)&plVar4[1].ci;
    plVar4[1].stack_last = (StkId)0x0;
    plVar4[1].stack = (StkId)0x0;
    plVar4[1].end_ci = (CallInfo *)0x0;
    plVar4[1].base_ci = (CallInfo *)0x0;
    plVar4[1].l_gt.value.n = 3.04344437838208e-321;
    *(undefined8 *)&plVar4[1].env.tt = 0xc8000000c8;
    plVar4[1].env.value.gc = (GCObject *)0x0;
    for (lVar5 = 0x33; lVar5 != 0x3c; lVar5 = lVar5 + 1) {
      (&plVar4->next)[lVar5] = (GCObject *)0x0;
    }
    iVar2 = luaD_rawrunprotected(plVar4,f_luaopen,(void *)0x0);
    if (iVar2 == 0) {
      in_RCX = panic;
      plVar4->l_G->panic = panic;
      goto LAB_0010355f;
    }
    close_state(plVar4);
  }
  plVar4 = (lua_State *)0x0;
LAB_0010355f:
  for (pp_Var7 = &lualibs[0].func; *pp_Var7 != (lua_CFunction)0x0; pp_Var7 = pp_Var7 + 2) {
    lua_pushcclosure(plVar4,*pp_Var7,0);
    lua_pushstring(plVar4,((luaL_Reg *)(pp_Var7 + -1))->name);
    lua_call(plVar4,1,0);
  }
  luaL_register(plVar4,"bit",bitlib);
  if (argc < 2) {
    iVar2 = 8;
  }
  else {
    iVar2 = 1;
    lua_createtable(plVar4,1,nrec);
    lua_pushstring(plVar4,argv[1]);
    lua_rawseti(plVar4,-2,0);
    lua_setfield(plVar4,-0x2712,"arg");
    iVar3 = luaL_loadfile(plVar4,argv[1]);
    if (iVar3 == 0) {
      for (uVar8 = 2; (uint)argc != uVar8; uVar8 = uVar8 + 1) {
        lua_pushstring(plVar4,argv[uVar8]);
      }
      iVar3 = lua_pcall(plVar4,argc + -2,0,(int)in_RCX);
      if (iVar3 == 0) {
        plVar4 = plVar4->l_G->mainthread;
        luaF_close(plVar4,plVar4->stack);
        luaC_separateudata(plVar4,1);
        plVar4->errfunc = 0;
        do {
          plVar4->ci = plVar4->base_ci;
          pTVar1 = plVar4->base_ci->base;
          plVar4->top = pTVar1;
          plVar4->base = pTVar1;
          plVar4->nCcalls = 0;
          plVar4->baseCcalls = 0;
          iVar2 = luaD_rawrunprotected(plVar4,callallgcTM,(void *)0x0);
        } while (iVar2 != 0);
        close_state(plVar4);
        return 0;
      }
    }
    __stream = _stderr;
    pcVar6 = lua_tolstring(plVar4,-1,(size_t *)0x0);
    fprintf(__stream,"Error: %s\n",pcVar6);
  }
  return iVar2;
}

Assistant:

int main(int argc,char**argv){
lua_State*L=luaL_newstate();
int i;
luaL_openlibs(L);
luaL_register(L,"bit",bitlib);
if(argc<2)return sizeof(void*);
lua_createtable(L,0,1);
lua_pushstring(L,argv[1]);
lua_rawseti(L,-2,0);
lua_setglobal(L,"arg");
if(luaL_loadfile(L,argv[1]))
goto err;
for(i=2;i<argc;i++)
lua_pushstring(L,argv[i]);
if(lua_pcall(L,argc-2,0,0)){
err:
fprintf(stderr,"Error: %s\n",lua_tostring(L,-1));
return 1;
}
lua_close(L);
return 0;
}